

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O3

bool __thiscall SNMPPacket::build(SNMPPacket *this)

{
  OctetType *newObj;
  SNMP_VERSION SVar1;
  ErrorStatus EVar2;
  ErrorIndex EVar3;
  element_type *peVar4;
  OctetType *pOVar5;
  snmp_request_id_t sVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ComplexType *pCVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  shared_ptr<ComplexType> varBindList;
  OctetType *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  undefined1 local_e9;
  OctetType *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  pointer local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (this->packet != (ComplexType *)0x0) {
    (*(this->packet->super_BER_CONTAINER)._vptr_BER_CONTAINER[1])();
  }
  pCVar7 = (ComplexType *)operator_new(0x28);
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(pCVar7->super_BER_CONTAINER)._type)->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x30;
  (pCVar7->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__ComplexType_00114f58;
  (pCVar7->values).
  super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar7->values).
  super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar7->values).
  super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->packet = pCVar7;
  local_108 = (OctetType *)
              (this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  if (local_108 == (OctetType *)0x0) {
    p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Stack_100->_M_use_count = 1;
    p_Stack_100->_M_weak_count = 1;
    p_Stack_100->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115788;
    local_108 = (OctetType *)(p_Stack_100 + 1);
    SVar1 = this->snmpVersion;
    p_Stack_100[1]._M_use_count = 2;
    p_Stack_100[1]._M_weak_count = 0;
    p_Stack_100[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_00115568;
    *(SNMP_VERSION *)&p_Stack_100[2]._vptr__Sp_counted_base = SVar1;
    ComplexType::addValueToList
              ((ComplexType *)(local_60 + 0x10),(shared_ptr<BER_CONTAINER> *)pCVar7);
    local_38 = local_48;
  }
  else {
    p_Stack_100 = (this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
      }
    }
    ComplexType::addValueToList
              ((ComplexType *)&stack0xffffffffffffffc0,(shared_ptr<BER_CONTAINER> *)pCVar7);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  peVar4 = (this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pCVar7 = this->packet;
  if (peVar4 == (element_type *)0x0) {
    local_78 = (pointer)(this->communityString)._M_dataplus._M_p;
    local_e8 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OctetType,std::allocator<OctetType>,char_const*>
              (&_Stack_e0,&local_e8,(allocator<OctetType> *)&local_e9,(char **)&local_78);
    local_108 = local_e8;
    p_Stack_100 = _Stack_e0._M_pi;
    local_e8 = (OctetType *)0x0;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)local_70,(shared_ptr<BER_CONTAINER> *)pCVar7);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    this_01._M_pi = _Stack_e0._M_pi;
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
      this_01._M_pi = _Stack_e0._M_pi;
    }
  }
  else {
    p_Stack_100 = (this->communityStringPtr).
                  super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
      }
    }
    local_108 = peVar4;
    ComplexType::addValueToList((ComplexType *)local_60,(shared_ptr<BER_CONTAINER> *)pCVar7);
    this_01._M_pi = p_Stack_100;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
      this_01._M_pi = p_Stack_100;
    }
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115828;
  newObj = (OctetType *)(this_00 + 1);
  this_00[1]._M_use_count = this->packetPDUType;
  this_00[1]._M_weak_count = 0;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ComplexType_00114f58;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[2]._M_use_count = 0;
  this_00[2]._M_weak_count = 0;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  pOVar5 = (OctetType *)
           (this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pOVar5 == (OctetType *)0x0) {
    p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Stack_100->_M_use_count = 1;
    p_Stack_100->_M_weak_count = 1;
    p_Stack_100->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115788;
    local_108 = (OctetType *)(p_Stack_100 + 1);
    sVar6 = this->requestID;
    p_Stack_100[1]._M_use_count = 2;
    p_Stack_100[1]._M_weak_count = 0;
    p_Stack_100[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_00115568;
    *(int *)&p_Stack_100[2]._vptr__Sp_counted_base = (int)sVar6;
    ComplexType::addValueToList((ComplexType *)local_98,(shared_ptr<BER_CONTAINER> *)newObj);
    local_88._8_8_ = local_98._8_8_;
  }
  else {
    p_Stack_100 = (this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
      }
    }
    local_108 = pOVar5;
    ComplexType::addValueToList((ComplexType *)local_88,(shared_ptr<BER_CONTAINER> *)newObj);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Stack_100->_M_use_count = 1;
  p_Stack_100->_M_weak_count = 1;
  p_Stack_100->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115788;
  local_108 = (OctetType *)(p_Stack_100 + 1);
  EVar2 = this->errorStatus;
  p_Stack_100[1]._M_use_count = 2;
  p_Stack_100[1]._M_weak_count = 0;
  p_Stack_100[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_00115568;
  *(ErrorStatus *)(p_Stack_100 + 2) = EVar2;
  ComplexType::addValueToList((ComplexType *)local_a8,(shared_ptr<BER_CONTAINER> *)newObj);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Stack_100->_M_use_count = 1;
  p_Stack_100->_M_weak_count = 1;
  p_Stack_100->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115788;
  local_108 = (OctetType *)(p_Stack_100 + 1);
  EVar3 = this->errorIndex;
  p_Stack_100[1]._M_use_count = 2;
  p_Stack_100[1]._M_weak_count = 0;
  p_Stack_100[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_00115568;
  *(ErrorIndex *)(p_Stack_100 + 2) = EVar3;
  ComplexType::addValueToList((ComplexType *)local_b8,(shared_ptr<BER_CONTAINER> *)newObj);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  (*this->_vptr_SNMPPacket[3])(&local_108,this);
  pOVar5 = local_108;
  if (local_108 != (OctetType *)0x0) {
    local_e8 = local_108;
    _Stack_e0._M_pi = p_Stack_100;
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
      }
    }
    ComplexType::addValueToList((ComplexType *)local_c8,(shared_ptr<BER_CONTAINER> *)newObj);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
    }
    pCVar7 = this->packet;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    local_e8 = newObj;
    _Stack_e0._M_pi = this_00;
    ComplexType::addValueToList((ComplexType *)local_d8,(shared_ptr<BER_CONTAINER> *)pCVar7);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
    }
  }
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return pOVar5 != (OctetType *)0x0;
}

Assistant:

bool SNMPPacket::build(){
    // Delete the existing packet if we've built it before (generally only traps)
    delete this->packet;

    this->packet = new ComplexType(STRUCTURE);
    // Try to reuse existing containers if we got em
    if(this->snmpVersionPtr)
        this->packet->addValueToList(this->snmpVersionPtr);
    else
        this->packet->addValueToList(std::make_shared<IntegerType>(this->snmpVersion));

    if(this->communityStringPtr)
        this->packet->addValueToList(this->communityStringPtr);
    else
        this->packet->addValueToList(std::make_shared<OctetType>(this->communityString.c_str()));

    auto snmpPDU = std::make_shared<ComplexType>(this->packetPDUType);

    if(this->requestIDPtr)
        snmpPDU->addValueToList(this->requestIDPtr);
    else
        snmpPDU->addValueToList(std::make_shared<IntegerType>(this->requestID));


    snmpPDU->addValueToList(std::make_shared<IntegerType>(this->errorStatus.errorStatus));
    snmpPDU->addValueToList(std::make_shared<IntegerType>(this->errorIndex.errorIndex));

    // We need to do this dynamically incase we're building a trap, generateVarBindList is virtual
    auto varBindList = this->generateVarBindList();
    if(!varBindList) return false;
    
    snmpPDU->addValueToList(varBindList);

    this->packet->addValueToList(snmpPDU);

    return true;
}